

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_variable.c
# Opt level: O2

char * environment_variable_create(char *name,char *default_value)

{
  char *pcVar1;
  size_t __n;
  char *__s;
  
  pcVar1 = getenv(name);
  __s = "";
  if (default_value != (char *)0x0) {
    __s = default_value;
  }
  if (pcVar1 != (char *)0x0) {
    __s = pcVar1;
  }
  __n = strlen(__s);
  pcVar1 = (char *)malloc(__n + 1);
  if (pcVar1 != (char *)0x0) {
    strncpy(pcVar1,__s,__n);
    pcVar1[__n] = '\0';
  }
  return pcVar1;
}

Assistant:

char *environment_variable_create(const char *name, const char *default_value)
{
	const char *variable_ptr = getenv(name);

	char *variable;

	size_t length;

	if (variable_ptr == NULL)
	{
		if (default_value == NULL)
		{
			static const char empty_variable[] = "";

			default_value = empty_variable;
		}

		variable_ptr = default_value;
	}

	length = strlen(variable_ptr);

	variable = malloc(sizeof(char) * (length + 1));

	if (variable == NULL)
	{
		return NULL;
	}

	strncpy(variable, variable_ptr, length);

	variable[length] = '\0';

	return variable;
}